

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O2

char * dialogNameOnly(void)

{
  undefined4 uVar1;
  int iVar2;
  char *in_RAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if (dialogNameOnly::lDialogName[0] == '*') {
    if (tinyfd_allowCursesDialogs != 0) {
      iVar2 = tfd_isDarwin();
      if (iVar2 != 0) {
        builtin_strncpy(dialogNameOnly::lDialogName,"/opt/local/bin/dialog",0x16);
        iVar2 = detectPresence(dialogNameOnly::lDialogName);
        if (iVar2 != 0) {
          return (char *)CONCAT44(extraout_var,iVar2);
        }
      }
      builtin_strncpy(dialogNameOnly::lDialogName,"dialog",7);
      uVar1 = dialogNameOnly::lDialogName._0_4_;
      dialogNameOnly::lDialogName._0_8_ = CONCAT44(dialogNameOnly::lDialogName._4_4_,uVar1);
      iVar2 = detectPresence(dialogNameOnly::lDialogName);
      in_RAX = (char *)CONCAT44(extraout_var_00,iVar2);
      if (iVar2 != 0) {
        return in_RAX;
      }
    }
    dialogNameOnly::lDialogName._0_8_ = dialogNameOnly::lDialogName._0_8_ & 0xffffffffffffff00;
  }
  return in_RAX;
}

Assistant:

static char * dialogNameOnly(void)
{
	static char lDialogName[128] = "*" ;
	if ( lDialogName[0] == '*' )
	{
		if (!tinyfd_allowCursesDialogs)
		{
			strcpy(lDialogName , "" );
		}
		else if ( tfd_isDarwin() && * strcpy(lDialogName , "/opt/local/bin/dialog" )
			&& detectPresence( lDialogName ) )
		{}
		else if ( * strcpy(lDialogName , "dialog" )
			&& detectPresence( lDialogName ) )
		{}
		else
		{
			strcpy(lDialogName , "" );
		}
	}
	return lDialogName ;
}